

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonParser.cpp
# Opt level: O1

string * __thiscall
Json::JsonParser::parseNumber_abi_cxx11_(string *__return_storage_ptr__,JsonParser *this,char prev)

{
  JsonReader *this_00;
  int iVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  uint uVar7;
  JsonException *this_01;
  ulong uVar8;
  int iVar9;
  size_type sVar10;
  JsonParser *this_02;
  undefined8 uVar11;
  bool bVar12;
  double d;
  
  (this->__buffer_value)._M_string_length = 0;
  *(this->__buffer_value)._M_dataplus._M_p = '\0';
  bVar4 = false;
  bVar3 = false;
  if (prev != '+') {
    if (prev == '-') {
      bVar4 = true;
    }
    else {
      if (prev == '.') {
        std::__cxx11::string::append((char *)this);
        bVar3 = true;
        bVar4 = false;
        goto LAB_001092b7;
      }
      bVar4 = false;
      std::__cxx11::string::_M_replace_aux
                ((ulong)this,(this->__buffer_value)._M_string_length,0,'\x01');
    }
    bVar3 = false;
  }
LAB_001092b7:
  this_00 = &this->__reader;
  cVar5 = JsonReader::get(this_00);
  if (!bVar3) {
    if (cVar5 == '.') {
      if (9 < (byte)(prev - 0x30U)) {
        std::__cxx11::string::_M_replace_aux
                  ((ulong)this,(this->__buffer_value)._M_string_length,0,'\x01');
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)this,(this->__buffer_value)._M_string_length,0,'\x01');
      bVar3 = true;
      goto LAB_001093af;
    }
    uVar8 = (this->__buffer_value)._M_string_length;
    if (uVar8 == 0) {
      bVar12 = false;
    }
    else {
      bVar12 = (this->__buffer_value)._M_dataplus._M_p[uVar8 - 1] == '0';
    }
    if (((byte)(cVar5 - 0x30U) < 10) && (bVar12)) {
      iVar9 = (this->__reader).__ptr;
      if (0 < iVar9) {
        (this->__reader).__ptr = iVar9 + -1;
      }
      this_01 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(this_01,this_00);
LAB_00109681:
      __cxa_throw(this_01,&JsonException::typeinfo,JsonException::~JsonException);
    }
    if (((cVar5 == '-' && (byte)(prev ^ 0x2bU) == 0) || ((byte)(prev ^ 0x2bU) == 0 && cVar5 == '+'))
       || ((prev == '-' && ((cVar5 - 0x2bU & 0xfd) == 0)))) {
      this_01 = (JsonException *)__cxa_allocate_exception(0x50);
      JsonException::JsonException(this_01,this_00);
      goto LAB_00109681;
    }
    if ((byte)(cVar5 - 0x30U) < 10) {
      std::__cxx11::string::_M_replace_aux((ulong)this,uVar8,0,'\x01');
      goto LAB_001093af;
    }
  }
  iVar9 = (this->__reader).__ptr;
  if (0 < iVar9) {
    (this->__reader).__ptr = iVar9 + -1;
  }
LAB_001093af:
  do {
    bVar6 = JsonReader::get(this_00);
    uVar8 = (ulong)bVar6;
    if ((bVar6 < 0x21) && ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0)) {
LAB_001093c5:
      bVar12 = false;
    }
    else if ((byte)(bVar6 - 0x30) < 10) {
      if (bVar6 == 0x2e) {
LAB_001094ab:
        if (bVar3) {
          this_01 = (JsonException *)__cxa_allocate_exception(0x50);
          JsonException::JsonException(this_01,this_00);
          goto LAB_00109681;
        }
        bVar12 = false;
        std::__cxx11::string::_M_replace_aux
                  ((ulong)this,(this->__buffer_value)._M_string_length,0,'\x01');
        bVar3 = true;
      }
      else {
        if ((bVar6 == 0x65) || (bVar6 == 0x45)) {
LAB_00109443:
          uVar8 = (this->__buffer_value)._M_string_length;
          if ((uVar8 != 0) && ((this->__buffer_value)._M_dataplus._M_p[uVar8 - 1] == '.')) {
            iVar9 = (this->__reader).__ptr;
            if (0 < iVar9) {
              (this->__reader).__ptr = iVar9 + -1;
            }
            this_01 = (JsonException *)__cxa_allocate_exception(0x50);
            JsonException::JsonException(this_01,this_00);
            goto LAB_00109681;
          }
          std::__cxx11::string::_M_replace_aux((ulong)this,uVar8,0,'\x01');
          cVar5 = JsonReader::get(this_00);
          if (((9 < (byte)(cVar5 - 0x30U)) && (cVar5 != '+')) && (cVar5 != '-')) {
            this_01 = (JsonException *)__cxa_allocate_exception(0x50);
            JsonException::JsonException(this_01,this_00);
            goto LAB_00109681;
          }
          sVar10 = (this->__buffer_value)._M_string_length;
        }
        else {
          sVar10 = (this->__buffer_value)._M_string_length;
          if (1 < (int)sVar10) {
            if (sVar10 == 0) {
              uVar11 = 0;
LAB_001096a3:
              uVar11 = std::__throw_out_of_range_fmt
                                 ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                  ,uVar11);
              __cxa_free_exception(this);
              _Unwind_Resume(uVar11);
            }
            pcVar2 = (this->__buffer_value)._M_dataplus._M_p;
            if (*pcVar2 == '0') {
              if (sVar10 == 1) {
                uVar11 = 1;
                goto LAB_001096a3;
              }
              if ((byte)(pcVar2[1] - 0x30U) < 10) {
                iVar1 = (this->__reader).__len;
                uVar7 = (this->__reader).__ptr - (int)sVar10;
                iVar9 = uVar7 + 1;
                if (iVar9 < iVar1) {
                  iVar1 = iVar9;
                }
                iVar9 = 0;
                if (uVar7 < 0x7fffffff) {
                  iVar9 = iVar1;
                }
                (this->__reader).__ptr = iVar9;
                this_01 = (JsonException *)__cxa_allocate_exception(0x50);
                JsonException::JsonException(this_01,this_00);
                goto LAB_00109681;
              }
            }
          }
        }
        bVar12 = false;
        std::__cxx11::string::_M_replace_aux((ulong)this,sVar10,0,'\x01');
      }
    }
    else {
      if (bVar6 == 0x2e) goto LAB_001094ab;
      if ((bVar6 == 0x45) || (bVar6 == 0x65)) goto LAB_00109443;
      sVar10 = (this->__buffer_value)._M_string_length;
      if ((sVar10 != 0) && ((this->__buffer_value)._M_dataplus._M_p[sVar10 - 1] == '.')) {
        this_01 = (JsonException *)__cxa_allocate_exception(0x50);
        JsonException::JsonException(this_01,this_00);
        goto LAB_00109681;
      }
      bVar12 = true;
      if (bVar6 < 0x2d) {
        if ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_001093c5;
        if (uVar8 == 0x2c) goto LAB_001093c7;
      }
      if ((bVar6 != 0x5d) && (bVar6 != 0x7d)) {
        this_01 = (JsonException *)__cxa_allocate_exception(0x50);
        JsonException::JsonException(this_01,this_00);
        goto LAB_00109681;
      }
    }
LAB_001093c7:
    if (bVar12) {
      iVar9 = (this->__reader).__ptr;
      if (0 < iVar9) {
        (this->__reader).__ptr = iVar9 + -1;
      }
      if (bVar4) {
        std::__cxx11::string::insert((ulong)this,0,'\x01');
      }
      this_02 = (JsonParser *)0x0;
      d = strtod((this->__buffer_value)._M_dataplus._M_p,(char **)0x0);
      __num2str_abi_cxx11_(__return_storage_ptr__,this_02,d);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::string Json::JsonParser::parseNumber(char prev) {
    buffer_reset();
    bool __unique = false, __negative = false;
    // -.1234 => -0.1234, .1234 => 0.1234
    if (prev == '+');
    else if (prev == '-')__negative = true;
    else if (prev == '.') {
        buffer_append("0.");
        __unique = true;
    } else buffer_append(prev);

    char c = __reader.get();
    if (!__unique) {  // +., -., 1.
        if (c == '.') {
            if (!is_number(prev)) buffer_append('0');
            buffer_append(c);
            __unique = true;
        } else if (buffer_back() == '0' && is_number(c)) {
            __reader.back();
            throw JsonException(__reader);
        } else if ((prev == '+' && c == '-') || (prev == '+' && c == '+')
                   || (prev == '-' && c == '-') || (prev == '-' && c == '+'))
            throw JsonException(__reader);
        else if (is_number(c))buffer_append(c);
        else __reader.back();
    } else __reader.back();

    for (;;) {
        char c = __reader.get();

        if (is_space_char(c)) continue;

        if (is_number(c) || c == '.' || c == 'e' || c == 'E') {
            // 1e+2, 1e-2, -1e2, .1e+2, 0.1e+2, -.1e+2, -e+2, -0e+2, .0e-3
            if (c == 'e' || c == 'E') {
                if (buffer_back() == '.') { // .E-3
                    __reader.back();
                    throw JsonException(__reader);
                }
                buffer_append(c);
                c = __reader.get();
                if (!(is_number(c) || c == '+' || c == '-')) throw JsonException(__reader);
                buffer_append(c);
            } else if (c == '.') {
                if (__unique) throw JsonException(__reader);
                buffer_append(c);
                __unique = true;
            } else {
                if (buffer_size() >= 2) {
                    if (buffer_index() == '0' && is_number(buffer_index(1))) {
                        __reader.moveTo(-(buffer_size() - 1));
                        throw JsonException(__reader);
                    }
                }
                buffer_append(c);
            }
        } else {
            if (buffer_back() == '.') throw JsonException(__reader);
            if (c == JSON_SEPARATE || c == JSON_OBJECT_END || c == JSON_ARRAY_END)break;
            if (is_space_char(c))continue;
            else throw JsonException(__reader);
        }
    }
    __reader.back();
    if (__negative)
        buffer_insert('-');
    return __num2str(strtod((buffer_str()), nullptr));
}